

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * GetQuote(ConfigScanner *sc)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  long in_RDI;
  size_t step_1;
  char ch_1;
  char *d;
  char *s;
  char *temp;
  size_t length;
  size_t step;
  char ch;
  char *start;
  char local_49;
  char *local_48;
  char *local_40;
  char local_19;
  
  if (in_RDI != 0) {
    local_40 = *(char **)(in_RDI + 0x18);
    while (((local_19 = **(char **)(in_RDI + 0x18), local_19 != '\r' && (local_19 != '\n')) &&
           (local_19 != '\0'))) {
      if (local_19 == '\"') {
        lVar1 = *(long *)(in_RDI + 0x18) - (long)local_40;
        __s = (char *)malloc(lVar1 + 1);
        memset(__s,0,lVar1 + 1);
        local_48 = __s;
        for (; local_49 = *local_40, local_49 != '\"'; local_40 = local_40 + sVar2) {
          if (local_49 == '\\') {
            local_49 = local_40[1];
            local_40 = local_40 + 1;
          }
          sVar2 = GetUTF8Length(local_49);
          memcpy(local_48,local_40,sVar2);
          local_48 = local_48 + sVar2;
        }
        if (**(char **)(in_RDI + 0x18) == '\"') {
          *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
          return __s;
        }
        return __s;
      }
      if (local_19 == '\\') {
        lVar1 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar1 + 1;
        local_19 = *(char *)(lVar1 + 1);
      }
      sVar2 = GetUTF8Length(local_19);
      if (sVar2 == 0) {
        return (char *)0x0;
      }
      *(size_t *)(in_RDI + 0x18) = sVar2 + *(long *)(in_RDI + 0x18);
    }
  }
  return (char *)0x0;
}

Assistant:

char *GetQuote(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			return NULL;
		}
		else if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++sc->ptr;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	char *s = start;
	char *d = temp;
	while (true)
	{
		char ch = *s;
		if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++s;
		}
		size_t step = GetUTF8Length(ch);
		memcpy(d, s, step);
		s += step;
		d += step;
	}
	if (*sc->ptr == '"')
	{
		sc->ptr++;
	}
	return temp;
}